

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack16to1.h
# Opt level: O1

void ncnn::conv3x3s1_pack16to1_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  uint *puVar1;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  void *pvVar12;
  void *pvVar13;
  size_t sVar14;
  size_t sVar15;
  void *pvVar16;
  void *pvVar17;
  size_t sVar18;
  size_t sVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  byte bVar36;
  int iVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  long lVar41;
  undefined1 (*pauVar42) [64];
  void *pvVar43;
  ulong uVar44;
  long lVar45;
  long lVar46;
  int iVar47;
  float *pfVar48;
  long lVar49;
  ushort uVar50;
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [16];
  float fVar62;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  int size;
  
  iVar8 = top_blob->c;
  if (0 < (long)iVar8) {
    uVar9 = bottom_blob->c;
    iVar10 = top_blob->w;
    uVar11 = top_blob->h;
    pvVar12 = _bias->data;
    lVar41 = (long)top_blob->h * (long)top_blob->w;
    pvVar13 = top_blob->data;
    uVar39 = top_blob->elemsize;
    lVar38 = top_blob->cstep * uVar39;
    lVar49 = 0;
    iVar37 = (int)((uVar39 * lVar41 + 0xf & 0xfffffffffffffff0) / uVar39);
    if (top_blob->dims == 4) {
      iVar37 = (int)lVar41;
    }
    iVar37 = iVar37 * top_blob->d;
    sVar14 = kernel->cstep;
    sVar15 = kernel->elemsize;
    pvVar16 = kernel->data;
    pvVar17 = bottom_blob->data;
    sVar18 = bottom_blob->elemsize;
    sVar19 = bottom_blob->cstep;
    auVar52 = vpbroadcastq_avx512f();
    lVar41 = (long)bottom_blob->w * sVar18;
    auVar53 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar54 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    pvVar43 = pvVar13;
    do {
      if (pvVar12 == (void *)0x0) {
        auVar59 = ZEXT816(0) << 0x40;
      }
      else {
        auVar59 = ZEXT416(*(uint *)((long)pvVar12 + lVar49 * 4));
      }
      if (0 < iVar37) {
        auVar55 = vbroadcastss_avx512f(auVar59);
        uVar39 = 0;
        do {
          auVar56 = vpbroadcastq_avx512f();
          auVar57 = vporq_avx512f(auVar56,auVar53);
          auVar56 = vporq_avx512f(auVar56,auVar54);
          uVar34 = vpcmpuq_avx512f(auVar56,auVar52,2);
          uVar35 = vpcmpuq_avx512f(auVar57,auVar52,2);
          bVar36 = (byte)uVar35;
          uVar50 = CONCAT11(bVar36,(byte)uVar34);
          puVar1 = (uint *)((long)pvVar43 + uVar39 * 4);
          bVar20 = (bool)((byte)uVar34 & 1);
          bVar21 = (bool)((byte)(uVar50 >> 1) & 1);
          bVar22 = (bool)((byte)(uVar50 >> 2) & 1);
          bVar23 = (bool)((byte)(uVar50 >> 3) & 1);
          bVar24 = (bool)((byte)(uVar50 >> 4) & 1);
          bVar25 = (bool)((byte)(uVar50 >> 5) & 1);
          bVar26 = (bool)((byte)(uVar50 >> 6) & 1);
          bVar27 = (bool)((byte)(uVar50 >> 7) & 1);
          bVar28 = (bool)(bVar36 >> 1 & 1);
          bVar29 = (bool)(bVar36 >> 2 & 1);
          bVar30 = (bool)(bVar36 >> 3 & 1);
          bVar31 = (bool)(bVar36 >> 4 & 1);
          bVar32 = (bool)(bVar36 >> 5 & 1);
          bVar33 = (bool)(bVar36 >> 6 & 1);
          *puVar1 = (uint)bVar20 * auVar55._0_4_ | (uint)!bVar20 * *puVar1;
          puVar1[1] = (uint)bVar21 * auVar55._4_4_ | (uint)!bVar21 * puVar1[1];
          puVar1[2] = (uint)bVar22 * auVar55._8_4_ | (uint)!bVar22 * puVar1[2];
          puVar1[3] = (uint)bVar23 * auVar55._12_4_ | (uint)!bVar23 * puVar1[3];
          puVar1[4] = (uint)bVar24 * auVar55._16_4_ | (uint)!bVar24 * puVar1[4];
          puVar1[5] = (uint)bVar25 * auVar55._20_4_ | (uint)!bVar25 * puVar1[5];
          puVar1[6] = (uint)bVar26 * auVar55._24_4_ | (uint)!bVar26 * puVar1[6];
          puVar1[7] = (uint)bVar27 * auVar55._28_4_ | (uint)!bVar27 * puVar1[7];
          puVar1[8] = (uint)(bVar36 & 1) * auVar55._32_4_ | (uint)!(bool)(bVar36 & 1) * puVar1[8];
          puVar1[9] = (uint)bVar28 * auVar55._36_4_ | (uint)!bVar28 * puVar1[9];
          puVar1[10] = (uint)bVar29 * auVar55._40_4_ | (uint)!bVar29 * puVar1[10];
          puVar1[0xb] = (uint)bVar30 * auVar55._44_4_ | (uint)!bVar30 * puVar1[0xb];
          puVar1[0xc] = (uint)bVar31 * auVar55._48_4_ | (uint)!bVar31 * puVar1[0xc];
          puVar1[0xd] = (uint)bVar32 * auVar55._52_4_ | (uint)!bVar32 * puVar1[0xd];
          puVar1[0xe] = (uint)bVar33 * auVar55._56_4_ | (uint)!bVar33 * puVar1[0xe];
          puVar1[0xf] = (uint)(bVar36 >> 7) * auVar55._60_4_ |
                        (uint)!(bool)(bVar36 >> 7) * puVar1[0xf];
          uVar39 = uVar39 + 0x10;
        } while ((iVar37 + 0xfU & 0xfffffff0) != uVar39);
      }
      if (0 < (int)uVar9) {
        pauVar42 = (undefined1 (*) [64])(sVar14 * sVar15 * lVar49 + (long)pvVar16);
        lVar40 = 0x80;
        uVar39 = 0;
        do {
          if (0 < (int)uVar11) {
            auVar55 = *pauVar42;
            auVar56 = pauVar42[1];
            auVar57 = pauVar42[2];
            auVar2 = pauVar42[3];
            auVar3 = pauVar42[4];
            auVar4 = pauVar42[5];
            auVar5 = pauVar42[6];
            auVar6 = pauVar42[7];
            auVar7 = pauVar42[8];
            uVar44 = 0;
            lVar46 = lVar40;
            pfVar48 = (float *)(lVar38 * lVar49 + (long)pvVar13);
            do {
              lVar45 = lVar46;
              iVar47 = iVar10;
              if (0 < iVar10) {
                do {
                  auVar58 = vmulps_avx512f(auVar55,*(undefined1 (*) [64])
                                                    ((long)pvVar17 + lVar45 + -0x80));
                  auVar58 = vfmadd231ps_avx512f(auVar58,auVar2,
                                                *(undefined1 (*) [64])
                                                 ((long)pvVar17 + lVar45 + lVar41 + -0x80));
                  auVar58 = vfmadd231ps_avx512f(auVar58,auVar5,
                                                *(undefined1 (*) [64])
                                                 ((long)pvVar17 + lVar45 + lVar41 * 2 + -0x80));
                  auVar58 = vfmadd231ps_avx512f(auVar58,auVar56,
                                                *(undefined1 (*) [64])
                                                 ((long)pvVar17 + lVar45 + -0x40));
                  auVar58 = vfmadd231ps_avx512f(auVar58,auVar3,
                                                *(undefined1 (*) [64])
                                                 ((long)pvVar17 + lVar45 + lVar41 + -0x40));
                  auVar58 = vfmadd231ps_avx512f(auVar58,auVar6,
                                                *(undefined1 (*) [64])
                                                 ((long)pvVar17 + lVar45 + lVar41 * 2 + -0x40));
                  auVar58 = vfmadd231ps_avx512f(auVar58,auVar57,
                                                *(undefined1 (*) [64])((long)pvVar17 + lVar45));
                  auVar58 = vfmadd231ps_avx512f(auVar58,auVar4,
                                                *(undefined1 (*) [64])
                                                 ((long)pvVar17 + lVar45 + lVar41));
                  auVar58 = vfmadd231ps_avx512f(auVar58,auVar7,
                                                *(undefined1 (*) [64])
                                                 ((long)pvVar17 + lVar45 + lVar41 * 2));
                  auVar51 = vextractf64x4_avx512f(auVar58,1);
                  fVar62 = auVar58._4_4_ + auVar51._4_4_;
                  auVar60._0_4_ = auVar58._0_4_ + auVar51._0_4_ + auVar58._16_4_ + auVar51._16_4_;
                  auVar60._4_4_ = fVar62 + fVar62;
                  auVar60._8_4_ = auVar58._8_4_ + auVar51._8_4_ + auVar58._24_4_ + auVar51._24_4_;
                  auVar60._12_4_ = auVar58._12_4_ + auVar51._12_4_ + auVar58._28_4_ + auVar51._28_4_
                  ;
                  auVar59 = vshufpd_avx(auVar60,auVar60,1);
                  auVar61._0_4_ = auVar59._0_4_ + auVar60._0_4_;
                  auVar61._4_4_ = auVar59._4_4_ + auVar60._4_4_;
                  auVar61._8_4_ = auVar59._8_4_ + auVar60._8_4_;
                  auVar61._12_4_ = auVar59._12_4_ + auVar60._12_4_;
                  auVar59 = vmovshdup_avx(auVar61);
                  *pfVar48 = auVar59._0_4_ + *pfVar48 + auVar61._0_4_;
                  pfVar48 = pfVar48 + 1;
                  iVar47 = iVar47 + -1;
                  lVar45 = lVar45 + 0x40;
                } while (iVar47 != 0);
              }
              uVar44 = uVar44 + 1;
              lVar46 = lVar46 + lVar41;
            } while (uVar44 != uVar11);
          }
          pauVar42 = pauVar42 + 9;
          uVar39 = uVar39 + 1;
          lVar40 = lVar40 + sVar19 * sVar18;
        } while (uVar39 != uVar9);
      }
      lVar49 = lVar49 + 1;
      pvVar43 = (void *)((long)pvVar43 + lVar38);
    } while (lVar49 != iVar8);
  }
  return;
}

Assistant:

static void conv3x3s1_pack16to1_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* bias = _bias;

    int remain_outch_start = 0;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;
        out0.fill(bias0);

        const float* k0 = kernel.channel(p);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            __m512 _k00 = _mm512_loadu_ps(k0);
            __m512 _k01 = _mm512_loadu_ps(k0 + 16);
            __m512 _k02 = _mm512_loadu_ps(k0 + 16 * 2);
            __m512 _k10 = _mm512_loadu_ps(k0 + 16 * 3);
            __m512 _k11 = _mm512_loadu_ps(k0 + 16 * 4);
            __m512 _k12 = _mm512_loadu_ps(k0 + 16 * 5);
            __m512 _k20 = _mm512_loadu_ps(k0 + 16 * 6);
            __m512 _k21 = _mm512_loadu_ps(k0 + 16 * 7);
            __m512 _k22 = _mm512_loadu_ps(k0 + 16 * 8);

            int i = 0;

            for (; i < outh; i++)
            {
                const float* r0 = img0.row(i);
                const float* r1 = img0.row(i + 1);
                const float* r2 = img0.row(i + 2);

                int j = 0;
                for (; j < outw; j++)
                {
                    __m512 _r00 = _mm512_loadu_ps(r0);
                    __m512 _r01 = _mm512_loadu_ps(r0 + 16);
                    __m512 _r02 = _mm512_loadu_ps(r0 + 32);

                    __m512 _sum0 = _mm512_mul_ps(_k00, _r00);
                    __m512 _sum1 = _mm512_mul_ps(_k01, _r01);
                    __m512 _sum2 = _mm512_mul_ps(_k02, _r02);

                    __m512 _r10 = _mm512_loadu_ps(r1);
                    __m512 _r11 = _mm512_loadu_ps(r1 + 16);
                    __m512 _r12 = _mm512_loadu_ps(r1 + 32);

                    _sum0 = _mm512_fmadd_ps(_k10, _r10, _sum0);
                    _sum1 = _mm512_fmadd_ps(_k11, _r11, _sum1);
                    _sum2 = _mm512_fmadd_ps(_k12, _r12, _sum2);

                    __m512 _r20 = _mm512_loadu_ps(r2);
                    __m512 _r21 = _mm512_loadu_ps(r2 + 16);
                    __m512 _r22 = _mm512_loadu_ps(r2 + 32);

                    _sum0 = _mm512_fmadd_ps(_k20, _r20, _sum0);
                    _sum1 = _mm512_fmadd_ps(_k21, _r21, _sum1);
                    _sum2 = _mm512_fmadd_ps(_k22, _r22, _sum2);

                    __m512 _sum = _mm512_add_ps(_sum0, _mm512_add_ps(_sum1, _sum2));

                    *outptr0 += _mm512_comp_reduce_add_ps(_sum);
                    outptr0++;
                    r0 += 16;
                    r1 += 16;
                    r2 += 16;
                }
            }

            k0 += 9 * 16;
        }
    }
}